

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChiliException.h
# Opt level: O1

wstring * __thiscall
ChiliException::GetLocation_abi_cxx11_(wstring *__return_storage_ptr__,ChiliException *this)

{
  wstring *pwVar1;
  ulong uVar2;
  undefined8 uVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  local_80 = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_80,L"Line [",L"");
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_a0,vswprintf,0x10,L"%u",(ulong)this->line);
  uVar2 = 3;
  if (local_80 != local_70) {
    uVar2 = local_70[0];
  }
  if (uVar2 < local_a0._M_string_length + local_78) {
    uVar3 = 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar3 = local_a0.field_2._M_allocated_capacity;
    }
    if (local_a0._M_string_length + local_78 <= (ulong)uVar3) {
      pwVar1 = (wstring *)
               std::__cxx11::wstring::replace((ulong)&local_a0,0,(wchar_t *)0x0,(ulong)local_80);
      goto LAB_00120215;
    }
  }
  pwVar1 = (wstring *)
           std::__cxx11::wstring::_M_append((wchar_t *)&local_80,(ulong)local_a0._M_dataplus._M_p);
LAB_00120215:
  std::__cxx11::wstring::wstring((wstring *)local_60,pwVar1);
  pwVar1 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_60);
  std::__cxx11::wstring::wstring((wstring *)local_40,pwVar1);
  pwVar1 = (wstring *)
           std::__cxx11::wstring::_M_append
                     ((wchar_t *)local_40,(ulong)(this->file)._M_dataplus._M_p);
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,pwVar1);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring GetLocation() const
	{
		return std::wstring( L"Line [" ) + std::to_wstring( line ) + L"] in " + file;
	}